

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFTokenizer.cc
# Opt level: O0

void __thiscall qpdf::Tokenizer::inHexstring(Tokenizer *this,char ch)

{
  bool bVar1;
  allocator<char> local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  char local_12;
  char local_11;
  char hval;
  Tokenizer *pTStack_10;
  char ch_local;
  Tokenizer *this_local;
  
  local_11 = ch;
  pTStack_10 = this;
  local_12 = util::hex_decode_char(ch);
  if (local_12 < '\x10') {
    this->char_code = (int)local_12 << 4;
    this->state = st_in_hexstring_2nd;
  }
  else if (local_11 == '>') {
    this->type = tt_string;
    this->state = st_token_ready;
  }
  else {
    bVar1 = isSpace(this,local_11);
    if (!bVar1) {
      this->type = tt_bad;
      QTC::TC("qpdf","QPDFTokenizer bad hexstring character",0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,"invalid character (",&local_79);
      std::operator+(&local_58,&local_78,local_11);
      std::operator+(&local_38,&local_58,") in hexstring");
      std::__cxx11::string::operator=((string *)&this->error_message,(string *)&local_38);
      std::__cxx11::string::~string((string *)&local_38);
      std::__cxx11::string::~string((string *)&local_58);
      std::__cxx11::string::~string((string *)&local_78);
      std::allocator<char>::~allocator(&local_79);
      this->state = st_token_ready;
    }
  }
  return;
}

Assistant:

void
Tokenizer::inHexstring(char ch)
{
    if (char hval = util::hex_decode_char(ch); hval < '\20') {
        char_code = int(hval) << 4;
        state = st_in_hexstring_2nd;

    } else if (ch == '>') {
        type = tt::tt_string;
        state = st_token_ready;

    } else if (isSpace(ch)) {
        // ignore

    } else {
        type = tt::tt_bad;
        QTC::TC("qpdf", "QPDFTokenizer bad hexstring character");
        error_message = std::string("invalid character (") + ch + ") in hexstring";
        state = st_token_ready;
    }
}